

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchTernarySimulate(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  Vec_Ptr_t *p;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  int local_48;
  int local_44;
  int w;
  int i;
  uint *pSim;
  uint *pSim1;
  uint *pSim0;
  Aig_Obj_t *pObj;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  for (local_44 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_44);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pvVar6 = Vec_PtrEntry(vSimInfo,pAVar4->Id);
      iVar1 = Aig_ObjFaninId0(pAVar4);
      pvVar7 = Vec_PtrEntry(vSimInfo,iVar1);
      iVar1 = Aig_ObjFaninId1(pAVar4);
      pvVar5 = Vec_PtrEntry(vSimInfo,iVar1);
      iVar1 = Aig_ObjFaninC0(pAVar4);
      if ((iVar1 == 0) || (iVar1 = Aig_ObjFaninC1(pAVar4), iVar1 == 0)) {
        iVar1 = Aig_ObjFaninC0(pAVar4);
        if ((iVar1 == 0) && (iVar1 = Aig_ObjFaninC1(pAVar4), iVar1 != 0)) {
          for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
            uVar3 = *(uint *)((long)pvVar7 + (long)local_48 * 4);
            uVar2 = Saig_SynchNot(*(uint *)((long)pvVar5 + (long)local_48 * 4));
            uVar3 = Saig_SynchAnd(uVar3,uVar2);
            *(uint *)((long)pvVar6 + (long)local_48 * 4) = uVar3;
          }
        }
        else {
          iVar1 = Aig_ObjFaninC0(pAVar4);
          if ((iVar1 == 0) || (iVar1 = Aig_ObjFaninC1(pAVar4), iVar1 != 0)) {
            for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
              uVar3 = Saig_SynchAnd(*(uint *)((long)pvVar7 + (long)local_48 * 4),
                                    *(uint *)((long)pvVar5 + (long)local_48 * 4));
              *(uint *)((long)pvVar6 + (long)local_48 * 4) = uVar3;
            }
          }
          else {
            for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
              uVar3 = Saig_SynchNot(*(uint *)((long)pvVar7 + (long)local_48 * 4));
              uVar3 = Saig_SynchAnd(uVar3,*(uint *)((long)pvVar5 + (long)local_48 * 4));
              *(uint *)((long)pvVar6 + (long)local_48 * 4) = uVar3;
            }
          }
        }
      }
      else {
        for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
          uVar3 = Saig_SynchNot(*(uint *)((long)pvVar7 + (long)local_48 * 4));
          uVar2 = Saig_SynchNot(*(uint *)((long)pvVar5 + (long)local_48 * 4));
          uVar3 = Saig_SynchAnd(uVar3,uVar2);
          *(uint *)((long)pvVar6 + (long)local_48 * 4) = uVar3;
        }
      }
    }
  }
  for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,local_44 + iVar1);
    pvVar6 = Vec_PtrEntry(vSimInfo,pAVar4->Id);
    iVar1 = Aig_ObjFaninId0(pAVar4);
    pvVar7 = Vec_PtrEntry(vSimInfo,iVar1);
    iVar1 = Aig_ObjFaninC0(pAVar4);
    if (iVar1 == 0) {
      for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
        *(undefined4 *)((long)pvVar6 + (long)local_48 * 4) =
             *(undefined4 *)((long)pvVar7 + (long)local_48 * 4);
      }
    }
    else {
      for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
        uVar3 = Saig_SynchNot(*(uint *)((long)pvVar7 + (long)local_48 * 4));
        *(uint *)((long)pvVar6 + (long)local_48 * 4) = uVar3;
      }
    }
  }
  return;
}

Assistant:

void Saig_SynchTernarySimulate( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim0, * pSim1, * pSim;
    int i, w;
    // simulate nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId1(pObj) );
        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), Saig_SynchNot(pSim1[w]) );
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], Saig_SynchNot(pSim1[w]) );
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), pSim1[w] );
        }
        else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], pSim1[w] );
        }
    }
    // transfer values to register inputs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjFaninC0(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchNot( pSim0[w] );
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = pSim0[w];
        }
    }
}